

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O2

void cdash_reporter_start_test(TestReporter *reporter,char *name)

{
  void *pvVar1;
  time_t tVar2;
  
  pvVar1 = reporter->memo;
  tVar2 = cdash_current_time((char *)0x0);
  *(time_t *)((long)pvVar1 + 0x38) = tVar2;
  reporter_start_test(reporter,name);
  return;
}

Assistant:

static void cdash_reporter_start_test(TestReporter *reporter, const char *name) {
    CDashMemo *memo = (CDashMemo *)reporter->memo;

    memo->teststarted = cdash_current_time(NULL);
    reporter_start_test(reporter, name);
}